

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

void __thiscall
cmTargetTraceDependencies::cmTargetTraceDependencies
          (cmTargetTraceDependencies *this,cmGeneratorTarget *target)

{
  iterator *piVar1;
  _Rb_tree_header *p_Var2;
  cmTarget *pcVar3;
  cmMakefile *this_00;
  cmLocalGenerator *pcVar4;
  _Elt_pointer ppcVar5;
  cmCustomCommand *pcVar6;
  bool bVar7;
  _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *__x;
  _Base_ptr p_Var8;
  string *psVar9;
  ostream *poVar10;
  _Base_ptr p_Var11;
  pointer config;
  cmCustomCommand *command;
  pointer ppcVar12;
  cmCustomCommand *pcVar13;
  _Rb_tree_header *p_Var14;
  bool bVar15;
  bool bVar16;
  pair<std::_Rb_tree_iterator<cmSourceFile_*>,_bool> pVar17;
  cmSourceFile *sf;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  tgts;
  set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_> emitted;
  ostringstream e;
  cmSourceFile *local_2b0;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_2a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_288;
  deque<cmSourceFile*,std::allocator<cmSourceFile*>> *local_270;
  _Rb_tree<cmSourceFile*,cmSourceFile*,std::_Identity<cmSourceFile*>,std::less<cmSourceFile*>,std::allocator<cmSourceFile*>>
  *local_268;
  string *local_260;
  string *local_258;
  pointer local_250;
  string local_248;
  _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  local_228;
  _Rb_tree<cmSourceFile_*,_cmSourceFile_*,_std::_Identity<cmSourceFile_*>,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_>
  local_1f8;
  string local_1c8;
  undefined1 local_1a8 [376];
  
  this->GeneratorTarget = target;
  local_270 = (deque<cmSourceFile*,std::allocator<cmSourceFile*>> *)&this->SourceQueue;
  (this->SourceQueue).c.super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->SourceQueue).c.super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->SourceQueue).c.super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->SourceQueue).c.super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->SourceQueue).c.super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->SourceQueue).c.super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->SourceQueue).c.super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->SourceQueue).c.super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->SourceQueue).c.super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->SourceQueue).c.super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::_M_initialize_map
            ((_Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_270,0);
  local_268 = (_Rb_tree<cmSourceFile*,cmSourceFile*,std::_Identity<cmSourceFile*>,std::less<cmSourceFile*>,std::allocator<cmSourceFile*>>
               *)&this->SourcesQueued;
  p_Var2 = &(this->SourcesQueued)._M_t._M_impl.super__Rb_tree_header;
  (this->SourcesQueued)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->SourcesQueued)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->SourcesQueued)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->SourcesQueued)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->SourcesQueued)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(this->NameMap)._M_t._M_impl.super__Rb_tree_header;
  (this->NameMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->NameMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->NameMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->NameMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->NameMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->NewSources).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->NewSources).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->NewSources).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar3 = target->Target;
  this_00 = pcVar3->Makefile;
  this->Makefile = this_00;
  pcVar4 = target->LocalGenerator;
  this->LocalGenerator = pcVar4;
  this->GlobalGenerator = pcVar4->GlobalGenerator;
  this->CurrentEntry = (SourceEntry *)0x0;
  if (pcVar3->TargetTypeValue != INTERFACE_LIBRARY) {
    local_288.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
    local_288.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
    local_288.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmMakefile::GetConfigurations(&local_1c8,this_00,&local_288,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    if (local_288.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_288.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::emplace_back<>(&local_288);
    }
    local_1f8._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1f8._M_impl.super__Rb_tree_header._M_header;
    local_1f8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1f8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1f8._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_260 = local_288.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    local_1f8._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1f8._M_impl.super__Rb_tree_header._M_header._M_left;
    if (local_288.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_288.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      _Rb_tree<cmSourceFile_*,_cmSourceFile_*,_std::_Identity<cmSourceFile_*>,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_>
      ::~_Rb_tree(&local_1f8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_288);
    }
    else {
      p_Var2 = &local_228._M_impl.super__Rb_tree_header;
      config = local_288.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_2a8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_2a8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_2a8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_258 = config;
        cmGeneratorTarget::GetSourceFiles(this->GeneratorTarget,&local_2a8,config);
        bVar7 = false;
        local_250 = local_2a8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        bVar16 = local_2a8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                 _M_impl.super__Vector_impl_data._M_start ==
                 local_2a8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        ppcVar12 = local_2a8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        while (!bVar16) {
          local_2b0 = *ppcVar12;
          __x = &cmGlobalGenerator::GetFilenameTargetDepends(this->GlobalGenerator,local_2b0)->_M_t;
          std::
          _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
          ::_Rb_tree(&local_228,__x);
          p_Var8 = &p_Var2->_M_header;
          if (local_228._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
            p_Var11 = local_228._M_impl.super__Rb_tree_header._M_header._M_parent;
            do {
              bVar15 = *(cmGeneratorTarget **)(p_Var11 + 1) < this->GeneratorTarget;
              if (!bVar15) {
                p_Var8 = p_Var11;
              }
              p_Var11 = (&p_Var11->_M_left)[bVar15];
            } while (p_Var11 != (_Base_ptr)0x0);
          }
          p_Var14 = p_Var2;
          if (((_Rb_tree_header *)p_Var8 != p_Var2) &&
             (p_Var14 = (_Rb_tree_header *)p_Var8,
             this->GeneratorTarget < (cmGeneratorTarget *)((_Rb_tree_header *)p_Var8)->_M_node_count
             )) {
            p_Var14 = p_Var2;
          }
          if (p_Var14 == p_Var2) {
            pVar17 = std::
                     _Rb_tree<cmSourceFile*,cmSourceFile*,std::_Identity<cmSourceFile*>,std::less<cmSourceFile*>,std::allocator<cmSourceFile*>>
                     ::_M_insert_unique<cmSourceFile*const&>
                               ((_Rb_tree<cmSourceFile*,cmSourceFile*,std::_Identity<cmSourceFile*>,std::less<cmSourceFile*>,std::allocator<cmSourceFile*>>
                                 *)&local_1f8,&local_2b0);
            if ((((undefined1  [16])pVar17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
               (pVar17 = std::
                         _Rb_tree<cmSourceFile*,cmSourceFile*,std::_Identity<cmSourceFile*>,std::less<cmSourceFile*>,std::allocator<cmSourceFile*>>
                         ::_M_insert_unique<cmSourceFile*const&>(local_268,&local_2b0),
               ((undefined1  [16])pVar17 & (undefined1  [16])0x1) != (undefined1  [16])0x0)) {
              ppcVar5 = (this->SourceQueue).c.
                        super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                        super__Deque_impl_data._M_finish._M_cur;
              if (ppcVar5 ==
                  (this->SourceQueue).c.
                  super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_last + -1) {
                std::deque<cmSourceFile*,std::allocator<cmSourceFile*>>::
                _M_push_back_aux<cmSourceFile*const&>(local_270,&local_2b0);
              }
              else {
                *ppcVar5 = local_2b0;
                piVar1 = &(this->SourceQueue).c.
                          super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl
                          .super__Deque_impl_data._M_finish;
                piVar1->_M_cur = piVar1->_M_cur + 1;
              }
            }
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Evaluation output file\n  \"",0x1a);
            psVar9 = cmSourceFile::GetFullPath(local_2b0,(string *)0x0);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,(psVar9->_M_dataplus)._M_p,
                                 psVar9->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,
                       "\"\ndepends on the sources of a target it is used in.  This is a dependency loop and is not allowed."
                       ,0x62);
            pcVar4 = this->GeneratorTarget->LocalGenerator;
            std::__cxx11::stringbuf::str();
            cmLocalGenerator::IssueMessage(pcVar4,FATAL_ERROR,&local_248);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_248._M_dataplus._M_p != &local_248.field_2) {
              operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
          }
          std::
          _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
          ::~_Rb_tree(&local_228);
          if (p_Var14 != p_Var2) {
            bVar7 = true;
            break;
          }
          ppcVar12 = ppcVar12 + 1;
          bVar16 = ppcVar12 == local_250;
        }
        if (local_2a8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_2a8.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_2a8.
                                super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_2a8.
                                super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (!bVar16) goto LAB_002ebdae;
        config = local_258 + 1;
      } while (config != local_260);
      bVar7 = false;
LAB_002ebdae:
      std::
      _Rb_tree<cmSourceFile_*,_cmSourceFile_*,_std::_Identity<cmSourceFile_*>,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_>
      ::~_Rb_tree(&local_1f8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_288);
      if (bVar7) {
        return;
      }
    }
  }
  pcVar3 = this->GeneratorTarget->Target;
  pcVar6 = (pcVar3->PreBuildCommands).
           super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pcVar13 = (pcVar3->PreBuildCommands).
                 super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>._M_impl.
                 super__Vector_impl_data._M_start; pcVar13 != pcVar6; pcVar13 = pcVar13 + 1) {
    CheckCustomCommand(this,pcVar13);
  }
  pcVar3 = this->GeneratorTarget->Target;
  pcVar6 = (pcVar3->PreLinkCommands).
           super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pcVar13 = (pcVar3->PreLinkCommands).
                 super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>._M_impl.
                 super__Vector_impl_data._M_start; pcVar13 != pcVar6; pcVar13 = pcVar13 + 1) {
    CheckCustomCommand(this,pcVar13);
  }
  pcVar3 = this->GeneratorTarget->Target;
  pcVar6 = (pcVar3->PostBuildCommands).
           super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pcVar13 = (pcVar3->PostBuildCommands).
                 super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>._M_impl.
                 super__Vector_impl_data._M_start; pcVar13 != pcVar6; pcVar13 = pcVar13 + 1) {
    CheckCustomCommand(this,pcVar13);
  }
  return;
}

Assistant:

cmTargetTraceDependencies::cmTargetTraceDependencies(cmGeneratorTarget* target)
  : GeneratorTarget(target)
{
  // Convenience.
  this->Makefile = target->Target->GetMakefile();
  this->LocalGenerator = target->GetLocalGenerator();
  this->GlobalGenerator = this->LocalGenerator->GetGlobalGenerator();
  this->CurrentEntry = nullptr;

  // Queue all the source files already specified for the target.
  if (target->GetType() != cmStateEnums::INTERFACE_LIBRARY) {
    std::vector<std::string> configs;
    this->Makefile->GetConfigurations(configs);
    if (configs.empty()) {
      configs.emplace_back();
    }
    std::set<cmSourceFile*> emitted;
    for (std::string const& c : configs) {
      std::vector<cmSourceFile*> sources;
      this->GeneratorTarget->GetSourceFiles(sources, c);
      for (cmSourceFile* sf : sources) {
        const std::set<cmGeneratorTarget const*> tgts =
          this->GlobalGenerator->GetFilenameTargetDepends(sf);
        if (tgts.find(this->GeneratorTarget) != tgts.end()) {
          std::ostringstream e;
          e << "Evaluation output file\n  \"" << sf->GetFullPath()
            << "\"\ndepends on the sources of a target it is used in.  This "
               "is a dependency loop and is not allowed.";
          this->GeneratorTarget->LocalGenerator->IssueMessage(
            MessageType::FATAL_ERROR, e.str());
          return;
        }
        if (emitted.insert(sf).second &&
            this->SourcesQueued.insert(sf).second) {
          this->SourceQueue.push(sf);
        }
      }
    }
  }

  // Queue pre-build, pre-link, and post-build rule dependencies.
  this->CheckCustomCommands(this->GeneratorTarget->GetPreBuildCommands());
  this->CheckCustomCommands(this->GeneratorTarget->GetPreLinkCommands());
  this->CheckCustomCommands(this->GeneratorTarget->GetPostBuildCommands());
}